

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O3

void ShowDoubleVector(vector<double,_std::allocator<double>_> *inVector)

{
  _Alloc_hider _Var1;
  size_t sVar2;
  pointer pdVar3;
  double local_58;
  string local_50;
  
  pdVar3 = (inVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
  if (pdVar3 != (inVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_58 = *pdVar3;
      BoxingBaseWithRW<double,STDStreamsReader<double>,STDStreamsWriter<double>>::
      ToString_abi_cxx11_(&local_50,&local_58);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_dataplus._M_p == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
      }
      else {
        sVar2 = strlen(local_50._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != (inVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  return;
}

Assistant:

static void ShowDoubleVector(const vector<double>& inVector)
{
	vector<double>::const_iterator it = inVector.begin();

	cout<<"[ ";
	for(;it != inVector.end();++it)
		cout<<Double(*it).ToString().c_str()<<" ";
	cout<<"]";	
}